

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Option::matching_name_abi_cxx11_(Option *this,Option *other)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  string *lname_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string *sname_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *lname;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string *sname;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool bothConfigurable;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  byte in_stack_fffffffffffffd47;
  undefined4 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd54;
  undefined1 in_stack_fffffffffffffd55;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined5 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd65;
  byte in_stack_fffffffffffffd66;
  undefined1 in_stack_fffffffffffffd67;
  __type_conflict local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  byte in_stack_fffffffffffffda7;
  bool local_229;
  byte local_211;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  reference local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  reference local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  size_type *local_190;
  byte local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  byte local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8 [2];
  reference local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  long local_a0;
  byte local_91;
  reference local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  long local_28;
  byte local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *local_8;
  
  local_18 = in_RSI;
  if ((matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_)
     , iVar4 != 0)) {
    ::std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd57,
                        CONCAT16(in_stack_fffffffffffffd56,
                                 CONCAT15(in_stack_fffffffffffffd55,
                                          CONCAT14(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50)))));
    __cxa_atexit(::std::__cxx11::string::~string,
                 &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_);
  }
  local_211 = 0;
  if ((*(byte *)(in_RDI + 0x23) & 1) != 0) {
    local_211 = *(byte *)((long)&local_18[1]._M_dataplus._M_p + 3);
  }
  local_19 = local_211 & 1;
  local_28 = in_RDI + 0x28;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffd38);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_fffffffffffffd38);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_a0 = in_RDI + 0x40;
      local_a8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(in_stack_fffffffffffffd38);
      local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(in_stack_fffffffffffffd38);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffd38), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_b8 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_a8);
        ::std::__cxx11::string::string(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        bVar1 = check_lname((Option *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                            in_stack_fffffffffffffd98);
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
        if (bVar1) {
          return local_b8;
        }
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(local_b8);
        if ((sVar5 == 1) && ((local_19 & 1) != 0)) {
          in_stack_fffffffffffffd98 = local_f8;
          ::std::__cxx11::string::string(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          in_stack_fffffffffffffda7 =
               check_sname((Option *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                           in_stack_fffffffffffffd98);
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
          if ((in_stack_fffffffffffffda7 & 1) != 0) {
            return local_b8;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_a8);
      }
      if (((((local_19 & 1) != 0) &&
           (bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffd57,
                                        CONCAT16(in_stack_fffffffffffffd56,
                                                 CONCAT15(in_stack_fffffffffffffd55,
                                                          CONCAT14(in_stack_fffffffffffffd54,
                                                                   in_stack_fffffffffffffd50))))),
           bVar1)) &&
          (bVar1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffd57,
                                       CONCAT16(in_stack_fffffffffffffd56,
                                                CONCAT15(in_stack_fffffffffffffd55,
                                                         CONCAT14(in_stack_fffffffffffffd54,
                                                                  in_stack_fffffffffffffd50))))),
          bVar1)) &&
         (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1b0f05), !bVar1)) {
        in_stack_fffffffffffffd80 = &local_118;
        in_stack_fffffffffffffd78 = local_18;
        ::std::__cxx11::string::string(in_stack_fffffffffffffd80,local_18);
        local_139 = 0;
        bVar1 = check_sname((Option *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                            in_stack_fffffffffffffd98);
        local_289 = true;
        if (!bVar1) {
          ::std::__cxx11::string::string(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          local_139 = 1;
          in_stack_fffffffffffffd67 =
               check_lname((Option *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                           in_stack_fffffffffffffd98);
          local_289 = true;
          if (!(bool)in_stack_fffffffffffffd67) {
            local_289 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffd67,
                                                      CONCAT16(in_stack_fffffffffffffd66,
                                                               CONCAT15(in_stack_fffffffffffffd65,
                                                                        in_stack_fffffffffffffd60)))
                                          ,in_stack_fffffffffffffd58);
          }
        }
        in_stack_fffffffffffffd66 = local_289;
        if ((local_139 & 1) != 0) {
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
          in_stack_fffffffffffffd66 = local_289;
        }
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
        if ((in_stack_fffffffffffffd66 & 1) != 0) {
          return (string *)(in_RDI + 0x88);
        }
      }
      if ((((local_19 & 1) != 0) &&
          (bVar1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffd57,
                                       CONCAT16(in_stack_fffffffffffffd56,
                                                CONCAT15(in_stack_fffffffffffffd55,
                                                         CONCAT14(in_stack_fffffffffffffd54,
                                                                  in_stack_fffffffffffffd50))))),
          bVar1)) &&
         ((bVar1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffd57,
                                       CONCAT16(in_stack_fffffffffffffd56,
                                                CONCAT15(in_stack_fffffffffffffd55,
                                                         CONCAT14(in_stack_fffffffffffffd54,
                                                                  in_stack_fffffffffffffd50))))),
          bVar1 && (bVar1 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)0x1b10f2), !bVar1)))) {
        __rhs = &local_160;
        ::std::__cxx11::string::string(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        local_181 = 0;
        uVar2 = check_sname((Option *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                            in_stack_fffffffffffffd98);
        bVar3 = true;
        if (!(bool)uVar2) {
          ::std::__cxx11::string::string(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          local_181 = 1;
          bVar1 = check_lname((Option *)
                              CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                              in_stack_fffffffffffffd98);
          bVar3 = true;
          if (!bVar1) {
            bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffd67,
                                                  CONCAT16(in_stack_fffffffffffffd66,
                                                           CONCAT15(uVar2,in_stack_fffffffffffffd60)
                                                          )),__rhs);
          }
        }
        if ((local_181 & 1) != 0) {
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
        }
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
        if ((bVar3 & 1) != 0) {
          return (string *)&local_18[4]._M_string_length;
        }
      }
      if (((*(byte *)(in_RDI + 0x21) & 1) != 0) || ((*(byte *)(in_RDI + 0x22) & 1) != 0)) {
        local_190 = &local_18[1]._M_string_length;
        local_198._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_fffffffffffffd38);
        local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(in_stack_fffffffffffffd38);
        while (bVar1 = __gnu_cxx::
                       operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                                  (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffffd38), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_1a8 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_198);
          ::std::__cxx11::string::string(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          bVar3 = check_sname((Option *)
                              CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                              in_stack_fffffffffffffd98);
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
          if ((bVar3 & 1) != 0) {
            return local_1a8;
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_198);
        }
        local_1d0 = local_18 + 2;
        local_1d8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_fffffffffffffd38);
        local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(in_stack_fffffffffffffd38);
        while (bVar1 = __gnu_cxx::
                       operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                                  (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffffd38), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_1e8 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_1d8);
          in_stack_fffffffffffffd38 = &local_208;
          ::std::__cxx11::string::string(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          in_stack_fffffffffffffd47 =
               check_lname((Option *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                           in_stack_fffffffffffffd98);
          ::std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
          if ((in_stack_fffffffffffffd47 & 1) != 0) {
            return local_1e8;
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_1d8);
        }
      }
      local_8 = &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_;
      return local_8;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_30);
    ::std::__cxx11::string::string(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    bVar1 = check_sname((Option *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                        in_stack_fffffffffffffd98);
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    if (bVar1) {
      return local_40;
    }
    local_91 = 0;
    local_229 = false;
    if ((local_19 & 1) != 0) {
      ::std::__cxx11::string::string(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      local_91 = 1;
      local_229 = check_lname((Option *)
                              CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                              in_stack_fffffffffffffd98);
    }
    if ((local_91 & 1) != 0) {
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
    }
    if (local_229 != false) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30);
  }
  return local_40;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const std::string &Option::matching_name(const Option &other) const {
    static const std::string estring;
    bool bothConfigurable = configurable_ && other.configurable_;
    for(const std::string &sname : snames_) {
        if(other.check_sname(sname))
            return sname;
        if(bothConfigurable && other.check_lname(sname))
            return sname;
    }
    for(const std::string &lname : lnames_) {
        if(other.check_lname(lname))
            return lname;
        if(lname.size() == 1 && bothConfigurable) {
            if(other.check_sname(lname)) {
                return lname;
            }
        }
    }
    if(bothConfigurable && snames_.empty() && lnames_.empty() && !pname_.empty()) {
        if(other.check_sname(pname_) || other.check_lname(pname_) || pname_ == other.pname_)
            return pname_;
    }
    if(bothConfigurable && other.snames_.empty() && other.fnames_.empty() && !other.pname_.empty()) {
        if(check_sname(other.pname_) || check_lname(other.pname_) || (pname_ == other.pname_))
            return other.pname_;
    }
    if(ignore_case_ ||
       ignore_underscore_) {  // We need to do the inverse, in case we are ignore_case or ignore underscore
        for(const std::string &sname : other.snames_)
            if(check_sname(sname))
                return sname;
        for(const std::string &lname : other.lnames_)
            if(check_lname(lname))
                return lname;
    }
    return estring;
}